

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *
Kernel::operator*(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
                 Numeral *n,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *self)

{
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:609:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  it;
  undefined1 auVar1 [24];
  unsigned_long in_stack_ffffffffffffffd0;
  
  auVar1 = ZEXT824(self);
  it._iter._inner._inner._from =
       ((long)(self->_summands)._cursor - (long)(self->_summands)._stack) / 0x30;
  it._iter._func.n = (Numeral *)auVar1._0_8_;
  it._iter._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)auVar1._8_8_;
  it._iter._inner._inner._next = auVar1._16_8_;
  it._iter._inner._inner._to = in_stack_ffffffffffffffd0;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>::operator*(it);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            (__return_storage_ptr__,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
             &stack0xffffffffffffffd0);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
             &stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

Polynom operator*(Numeral n, Polynom const& self) 
  { return Polynom(self.iterSummands()
      .map([&](auto m) { return n * m; })
      .template collect<Stack>()); }